

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O2

ssize_t __thiscall dtc::dtb::string_table::write(string_table *this,int __fd,void *__buf,size_t __n)

{
  pointer pbVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar4;
  allocator<char> local_39;
  string local_38 [32];
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Strings table.",&local_39);
  (**(code **)(*plVar3 + 8))(plVar3,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"dt_strings_start",&local_39);
  (**(code **)*plVar3)(plVar3,local_38);
  std::__cxx11::string::~string(local_38);
  pbVar1 = (this->strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    (**(code **)(*plVar3 + 0x10))(plVar3,pbVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,"dt_strings_end",&local_39);
  (**(code **)*plVar3)(plVar3,local_38);
  sVar2 = std::__cxx11::string::~string(local_38);
  return sVar2;
}

Assistant:

void
string_table::write(dtb::output_writer &writer)
{
	writer.write_comment("Strings table.");
	writer.write_label("dt_strings_start");
	for (auto &i : strings)
	{
		writer.write_string(i);
	}
	writer.write_label("dt_strings_end");
}